

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.cpp
# Opt level: O1

Table * wasm::ModuleUtils::copyTable(Table *table,Module *out)

{
  char *pcVar1;
  size_t sVar2;
  Table *pTVar3;
  __uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_> local_20;
  __single_object ret;
  
  local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
       (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)operator_new(0x58);
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x40) = 0;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x48) = 0;
  *(size_t *)
   local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl = 0;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 8) = 0;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x18) = 0;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x20) = 0;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x28) = 0;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x30) = 0;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x38) = 0;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x40) = 0xffffffff;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x48) = 2;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x50) = 0x12;
  pcVar1 = (table->super_Importable).super_Named.name.super_IString.str._M_str;
  *(size_t *)
   local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
       (table->super_Importable).super_Named.name.super_IString.str._M_len;
  *(char **)((long)local_20._M_t.
                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 8) = pcVar1;
  *(bool *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x10) =
       (table->super_Importable).super_Named.hasExplicitName;
  pcVar1 = (table->super_Importable).module.super_IString.str._M_str;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x18) =
       (table->super_Importable).module.super_IString.str._M_len;
  *(char **)((long)local_20._M_t.
                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x20) = pcVar1;
  pcVar1 = (table->super_Importable).base.super_IString.str._M_str;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x28) =
       (table->super_Importable).base.super_IString.str._M_len;
  *(char **)((long)local_20._M_t.
                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x30) = pcVar1;
  sVar2 = (table->max).addr;
  *(address64_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x38) = (table->initial).addr;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x40) = sVar2;
  sVar2 = (table->type).id;
  *(uintptr_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x48) = (table->addressType).id
  ;
  *(size_t *)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x50) = sVar2;
  pTVar3 = Module::addTable(out,(unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                                &local_20);
  if ((_Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>)
      local_20._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl != (Table *)0x0) {
    operator_delete((void *)local_20._M_t.
                            super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                            .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl,0x58);
  }
  return pTVar3;
}

Assistant:

Table* copyTable(const Table* table, Module& out) {
  auto ret = std::make_unique<Table>();
  ret->name = table->name;
  ret->hasExplicitName = table->hasExplicitName;
  ret->type = table->type;
  ret->module = table->module;
  ret->base = table->base;

  ret->initial = table->initial;
  ret->max = table->max;
  ret->addressType = table->addressType;

  return out.addTable(std::move(ret));
}